

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  _Bool _Var1;
  uint8_t uVar2;
  int iVar3;
  int32_t iVar4;
  void *__src;
  uint *in_RSI;
  uint *in_RDI;
  int32_t k_2;
  int32_t k_1;
  uint16_t card;
  int32_t k;
  uint32_t cookie_1;
  int32_t i;
  uint8_t *bitmapOfRunContainers;
  uint32_t s;
  uint32_t cookie;
  _Bool hasrun;
  uint32_t startOffset;
  char *initbuf;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  int local_3c;
  int local_34;
  uint local_1c;
  uint *local_10;
  
  _Var1 = ra_has_run_container
                    ((roaring_array_t *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (_Var1) {
    *in_RSI = (*in_RDI - 1) * 0x10000 | 0x303b;
    local_1c = (int)(*in_RDI + 7) / 8;
    __src = roaring_calloc((size_t)in_stack_ffffffffffffffb0,
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_34 = 0; local_34 < (int)*in_RDI; local_34 = local_34 + 1) {
      uVar2 = get_container_type(*(container_t **)(*(long *)(in_RDI + 2) + (long)local_34 * 8),
                                 *(uint8_t *)(*(long *)(in_RDI + 6) + (long)local_34));
      if (uVar2 == '\x03') {
        *(byte *)((long)__src + (long)(local_34 / 8)) =
             *(byte *)((long)__src + (long)(local_34 / 8)) |
             (byte)(1 << ((byte)((long)local_34 % 8) & 0x1f));
        in_stack_ffffffffffffffb0 = __src;
      }
    }
    memcpy(in_RSI + 1,__src,(ulong)local_1c);
    local_10 = (uint *)((long)(in_RSI + 1) + (ulong)local_1c);
    roaring_free((void *)0x11a721);
    if ((int)*in_RDI < 4) {
      iVar3 = *in_RDI * 4;
    }
    else {
      iVar3 = *in_RDI * 8;
    }
    local_1c = iVar3 + 4 + local_1c;
  }
  else {
    *in_RSI = 0x303a;
    in_RSI[1] = *in_RDI;
    local_10 = in_RSI + 2;
    local_1c = *in_RDI * 4 + 8 + *in_RDI * 4;
  }
  for (local_3c = 0; local_3c < (int)*in_RDI; local_3c = local_3c + 1) {
    *(undefined2 *)local_10 = *(undefined2 *)(*(long *)(in_RDI + 4) + (long)local_3c * 2);
    iVar3 = container_get_cardinality
                      ((container_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       '\0');
    *(short *)((long)local_10 + 2) = (short)iVar3 + -1;
    local_10 = local_10 + 1;
  }
  if ((!_Var1) || (3 < (int)*in_RDI)) {
    for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < (int)*in_RDI;
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
      *local_10 = local_1c;
      local_10 = local_10 + 1;
      iVar4 = container_size_in_bytes
                        ((container_t *)CONCAT44(local_1c,in_stack_ffffffffffffffa8),'\0');
      in_stack_ffffffffffffffac = local_1c;
      local_1c = local_1c + iVar4;
    }
  }
  for (iVar3 = 0; iVar3 < (int)*in_RDI; iVar3 = iVar3 + 1) {
    iVar4 = container_write((container_t *)CONCAT44(in_stack_ffffffffffffffbc,iVar3),
                            (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
                            (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_10 = (uint *)((long)local_10 + (long)iVar4);
  }
  return (long)local_10 - (long)in_RSI;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((uint32_t)(ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)roaring_calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        roaring_free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(container_get_cardinality(ra->containers[k],
                                                             ra->typecodes[k]) -
                                   1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}